

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

bool __thiscall
libmatroska::KaxBlockBlob::AddFrameAuto
          (KaxBlockBlob *this,KaxTrackEntry *track,uint64 timecode,DataBuffer *buffer,
          LacingType lacing,KaxBlockBlob *PastBlock,KaxBlockBlob *ForwBlock)

{
  bool bVar1;
  KaxSimpleBlock *this_00;
  KaxInternalBlock *pKVar2;
  uint64 uVar3;
  bool bResult;
  KaxBlockBlob *PastBlock_local;
  LacingType lacing_local;
  DataBuffer *buffer_local;
  uint64 timecode_local;
  KaxTrackEntry *track_local;
  KaxBlockBlob *this_local;
  
  if ((this->SimpleBlockMode != BLOCK_BLOB_ALWAYS_SIMPLE) &&
     (((this->SimpleBlockMode != BLOCK_BLOB_SIMPLE_AUTO || (PastBlock != (KaxBlockBlob *)0x0)) ||
      (ForwBlock != (KaxBlockBlob *)0x0)))) {
    bVar1 = ReplaceSimpleByGroup(this);
    if (!bVar1) {
      return false;
    }
    bVar1 = KaxBlockGroup::AddFrame
                      ((this->Block).group,track,timecode,buffer,PastBlock,ForwBlock,lacing);
    return bVar1;
  }
  if ((this->bUseSimpleBlock & 1U) != 1) {
    __assert_fail("bUseSimpleBlock == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0x3dc,
                  "bool libmatroska::KaxBlockBlob::AddFrameAuto(const KaxTrackEntry &, uint64, DataBuffer &, LacingType, const KaxBlockBlob *, const KaxBlockBlob *)"
                 );
  }
  if ((this->Block).group == (KaxBlockGroup *)0x0) {
    this_00 = (KaxSimpleBlock *)operator_new(0xa0);
    KaxSimpleBlock::KaxSimpleBlock(this_00);
    (this->Block).simpleblock = this_00;
    KaxSimpleBlock::SetParent((this->Block).simpleblock,this->ParentCluster);
  }
  bVar1 = KaxInternalBlock::AddFrame
                    ((KaxInternalBlock *)(this->Block).group,track,timecode,buffer,lacing,false);
  if ((PastBlock == (KaxBlockBlob *)0x0) && (ForwBlock == (KaxBlockBlob *)0x0)) {
    KaxSimpleBlock::SetKeyframe((this->Block).simpleblock,true);
    KaxSimpleBlock::SetDiscardable((this->Block).simpleblock,false);
    return bVar1;
  }
  KaxSimpleBlock::SetKeyframe((this->Block).simpleblock,false);
  if (ForwBlock == (KaxBlockBlob *)0x0) {
LAB_001cb84e:
    if (PastBlock != (KaxBlockBlob *)0x0) {
      pKVar2 = operator_cast_to_KaxInternalBlock_(PastBlock);
      uVar3 = KaxInternalBlock::GlobalTimecode(pKVar2);
      if (timecode < uVar3) goto LAB_001cb87d;
    }
    KaxSimpleBlock::SetDiscardable((this->Block).simpleblock,false);
  }
  else {
    pKVar2 = operator_cast_to_KaxInternalBlock_(ForwBlock);
    uVar3 = KaxInternalBlock::GlobalTimecode(pKVar2);
    if (uVar3 <= timecode) goto LAB_001cb84e;
LAB_001cb87d:
    KaxSimpleBlock::SetDiscardable((this->Block).simpleblock,true);
  }
  return bVar1;
}

Assistant:

bool KaxBlockBlob::AddFrameAuto(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, LacingType lacing, const KaxBlockBlob * PastBlock, const KaxBlockBlob * ForwBlock)
{
  bool bResult = false;
#if MATROSKA_VERSION >= 2
  if ((SimpleBlockMode == BLOCK_BLOB_ALWAYS_SIMPLE) || (SimpleBlockMode == BLOCK_BLOB_SIMPLE_AUTO && PastBlock == NULL && ForwBlock == NULL)) {
    assert(bUseSimpleBlock == true);
    if (Block.simpleblock == NULL) {
      Block.simpleblock = new KaxSimpleBlock();
      Block.simpleblock->SetParent(*ParentCluster);
    }

    bResult = Block.simpleblock->AddFrame(track, timecode, buffer, lacing);
    if (PastBlock == NULL && ForwBlock == NULL) {
      Block.simpleblock->SetKeyframe(true);
      Block.simpleblock->SetDiscardable(false);
    } else {
      Block.simpleblock->SetKeyframe(false);
      if ((ForwBlock == NULL || ((const KaxInternalBlock &)*ForwBlock).GlobalTimecode() <= timecode) &&
          (PastBlock == NULL || ((const KaxInternalBlock &)*PastBlock).GlobalTimecode() <= timecode))
        Block.simpleblock->SetDiscardable(false);
      else
        Block.simpleblock->SetDiscardable(true);
    }
  }
  else
#endif
    if (ReplaceSimpleByGroup())
      bResult = Block.group->AddFrame(track, timecode, buffer, PastBlock, ForwBlock, lacing);

  return bResult;
}